

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>
::AddTestPattern(ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>
                 *this,char *test_suite_name,char *test_base_name,
                TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
                *meta_factory,CodeLocation *code_location)

{
  CodeLocation *this_00;
  long in_RDI;
  TestInfo *in_stack_ffffffffffffff58;
  CodeLocation *in_stack_ffffffffffffffb0;
  TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  TestInfo *in_stack_ffffffffffffffd0;
  
  this_00 = (CodeLocation *)(in_RDI + 0x50);
  operator_new(0x70);
  CodeLocation::CodeLocation(this_00,(CodeLocation *)in_stack_ffffffffffffff58);
  TestInfo::TestInfo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>
  ::
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo,void>
            ((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>
              *)this_00,in_stack_ffffffffffffff58);
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>_>_>
  ::push_back((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>_>_>
               *)this_00,(value_type *)in_stack_ffffffffffffff58);
  std::
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>
  ::~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<datarate_test::(anonymous_namespace)::DatarateTestSVC>::TestInfo>
                 *)0x7c38c2);
  CodeLocation::~CodeLocation((CodeLocation *)0x7c38cc);
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }